

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.cpp
# Opt level: O2

void __thiscall bidfx_public_api::price::pixie::FieldDef::FieldDef(FieldDef *this,FieldDef *to_copy)

{
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->type_ = DISCARD;
  this->encoding_ = NOT_DEFINED;
  this->fid_ = to_copy->fid_;
  this->type_ = to_copy->type_;
  std::__cxx11::string::_M_assign((string *)&this->name_);
  this->encoding_ = to_copy->encoding_;
  this->scale_ = to_copy->scale_;
  return;
}

Assistant:

FieldDef::FieldDef(const bidfx_public_api::price::pixie::FieldDef& to_copy)
{
    fid_ = to_copy.fid_;
    type_ = to_copy.type_;
    name_ = to_copy.name_;
    encoding_ = to_copy.encoding_;
    scale_ = to_copy.scale_;
}